

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerCoreInlines.h
# Opt level: O3

void __thiscall PowerCore::record(PowerCore *this,int field,int32_t val)

{
  bool bVar1;
  uint uVar2;
  byte bVar3;
  
  if (val < 0) {
    bVar3 = 0x1c - (char)(field << 2);
    (this->super_PowerCoreState).cr =
         ((this->super_PowerCoreState).SO | 8) << (bVar3 & 0x1f) |
         ~(0xf << (bVar3 & 0x1f)) & (this->super_PowerCoreState).cr;
    return;
  }
  bVar3 = (char)field * -4 + 0x1c;
  uVar2 = ~(0xf << (bVar3 & 0x1f)) & (this->super_PowerCoreState).cr;
  bVar1 = (this->super_PowerCoreState).SO;
  if (val != 0) {
    (this->super_PowerCoreState).cr = (bVar1 | 4) << (bVar3 & 0x1f) | uVar2;
    return;
  }
  (this->super_PowerCoreState).cr = (uint)(bVar1 | 2) << (bVar3 & 0x1f) | uVar2;
  return;
}

Assistant:

inline void PowerCore::record(int field, int32_t val)
{
    if(val < 0)
        setcr(field, 8 | SO);
    else if(val > 0)
        setcr(field, 4 | SO);
    else
        setcr(field, 2 | SO);
}